

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O0

int __thiscall stk::FileRead::close(FileRead *this,int __fd)

{
  FileRead *this_local;
  
  if (this->fd_ != (FILE *)0x0) {
    fclose((FILE *)this->fd_);
  }
  this->fd_ = (FILE *)0x0;
  this->wavFile_ = false;
  this->fileSize_ = 0;
  this->channels_ = 0;
  this->dataType_ = 0;
  this->fileRate_ = 0.0;
  return (int)this;
}

Assistant:

void FileRead :: close( void )
{
  if ( fd_ ) fclose( fd_ );
  fd_ = 0;
  wavFile_ = false;
  fileSize_ = 0;
  channels_ = 0;
  dataType_ = 0;
  fileRate_ = 0.0;
}